

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-flat-test.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_171e31::InterfaceTester_QuadraticConstraint_Pow2_isMultipliedOutAndInlined_Test::
TestBody(InterfaceTester_QuadraticConstraint_Pow2_isMultipliedOutAndInlined_Test *this)

{
  NumExpr e2;
  NumExpr e2_00;
  NumExpr expr;
  AlgConRange rr;
  NumExpr e1;
  NumExpr e1_00;
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  initializer_list<double> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  NumExpr e2_01;
  NumExpr e2_02;
  NumExpr e1_01;
  NumExpr e1_02;
  NumExpr e2_03;
  bool bVar1;
  reference pvVar2;
  anon_struct_8_0_00000001_for___align this_00;
  Interface *pIVar3;
  const_reference pvVar4;
  QuadTerms *pQVar5;
  int iVar6;
  InterfaceTesterWithBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>
  *in_RDI;
  MutAlgebraicCon MVar7;
  AssertionResult gtest_ar_;
  QuadTerms qt;
  LinTerms lt;
  vector<int,_std::allocator<int>_> xi;
  vector<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr,_std::allocator<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr>_>
  x;
  EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_> modeler;
  undefined7 in_stack_fffffffffffff528;
  undefined1 in_stack_fffffffffffff52f;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> *in_stack_fffffffffffff530;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff540;
  double in_stack_fffffffffffff548;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> *con;
  int line;
  EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *in_stack_fffffffffffff550;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> *this_01;
  undefined4 in_stack_fffffffffffff558;
  undefined4 in_stack_fffffffffffff55c;
  allocator_type *__a;
  ExprBase in_stack_fffffffffffff560;
  vector<int,_std::allocator<int>_> *this_02;
  Builder *in_stack_fffffffffffff568;
  vector<double,_std::allocator<double>_> *c;
  ExprBase in_stack_fffffffffffff570;
  Builder *in_stack_fffffffffffff578;
  size_type __n;
  ExprBase in_stack_fffffffffffff580;
  vector<int,_std::allocator<int>_> *this_03;
  vector<double,_std::allocator<double>_> *c_00;
  vector<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr,_std::allocator<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr>_>
  *in_stack_fffffffffffff5a0;
  LinTerms *this_04;
  undefined4 in_stack_fffffffffffff5a8;
  undefined8 in_stack_fffffffffffff5c8;
  Type type;
  double in_stack_fffffffffffff5d0;
  double in_stack_fffffffffffff5d8;
  undefined8 in_stack_fffffffffffff5e0;
  EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *in_stack_fffffffffffff5e8;
  string local_9b8 [40];
  string local_990 [40];
  AlgConRange local_968 [7];
  TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>
  *in_stack_fffffffffffff708;
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> local_818 [2];
  AssertionResult local_400;
  undefined1 local_3ed [57];
  value_type local_3b4;
  value_type local_3b0;
  value_type local_3ac;
  value_type *local_3a8;
  undefined8 local_3a0;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined8 *local_360;
  undefined8 local_358;
  undefined1 local_1f5 [60];
  LinTerms local_1b9;
  undefined1 local_100 [168];
  NumExpr local_58;
  NumExpr local_48;
  NumExpr local_38;
  vector<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr,_std::allocator<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr>_>
  local_28;
  Builder *local_10;
  
  iVar6 = (int)((ulong)in_stack_fffffffffffff5e0 >> 0x20);
  type = (Type)((ulong)in_stack_fffffffffffff5c8 >> 0x20);
  InterfaceTesterWithBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>
  ::GetModel((InterfaceTesterWithBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>
              *)0x148504);
  local_10 = (Builder *)
             mp::MakeEasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>>>
                       ((BasicProblem<mp::BasicProblemParams<int>_> *)
                        CONCAT17(in_stack_fffffffffffff52f,in_stack_fffffffffffff528));
  mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::AddVars
            (in_stack_fffffffffffff5e8,iVar6,in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,
             type);
  pvVar2 = std::
           vector<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr,_std::allocator<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr>_>
           ::operator[](&local_28,0);
  local_100._120_8_ = pvVar2->bld_;
  local_100._128_8_ = (pvVar2->expr_).super_ExprBase.impl_;
  e2_01.expr_.super_ExprBase.impl_ = (ExprBase)(ExprBase)in_stack_fffffffffffff580.impl_;
  e2_01.bld_ = in_stack_fffffffffffff578;
  local_100._136_16_ =
       (undefined1  [16])mp::operator*((double)in_stack_fffffffffffff570.impl_,e2_01);
  pvVar2 = std::
           vector<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr,_std::allocator<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr>_>
           ::operator[](&local_28,1);
  local_100._72_8_ = pvVar2->bld_;
  local_100._80_8_ = (pvVar2->expr_).super_ExprBase.impl_;
  e2_02.expr_.super_ExprBase.impl_ = (ExprBase)(ExprBase)in_stack_fffffffffffff580.impl_;
  e2_02.bld_ = in_stack_fffffffffffff578;
  local_100._88_16_ = (undefined1  [16])mp::operator*((double)in_stack_fffffffffffff570.impl_,e2_02)
  ;
  e1.expr_.super_ExprBase.impl_ = (ExprBase)(ExprBase)in_stack_fffffffffffff570.impl_;
  e1.bld_ = in_stack_fffffffffffff568;
  e2.bld_._4_4_ = in_stack_fffffffffffff55c;
  e2.bld_._0_4_ = in_stack_fffffffffffff558;
  e2.expr_.super_ExprBase.impl_ = (ExprBase)(ExprBase)in_stack_fffffffffffff560.impl_;
  local_100._152_16_ = (undefined1  [16])mp::operator+(e1,e2);
  e1_01.expr_.super_ExprBase.impl_ = (ExprBase)(ExprBase)in_stack_fffffffffffff580.impl_;
  e1_01.bld_ = in_stack_fffffffffffff578;
  local_58 = mp::operator+(e1_01,(double)in_stack_fffffffffffff570.impl_);
  e1_02.expr_.super_ExprBase.impl_ = (ExprBase)(ExprBase)in_stack_fffffffffffff580.impl_;
  e1_02.bld_ = in_stack_fffffffffffff578;
  local_48 = mp::operator^(e1_02,(double)in_stack_fffffffffffff570.impl_);
  pvVar2 = std::
           vector<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr,_std::allocator<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr>_>
           ::operator[](&local_28,2);
  local_100._40_8_ = pvVar2->bld_;
  local_100._48_8_ = (pvVar2->expr_).super_ExprBase.impl_;
  e2_03.expr_.super_ExprBase.impl_ = (ExprBase)(ExprBase)in_stack_fffffffffffff580.impl_;
  e2_03.bld_ = in_stack_fffffffffffff578;
  local_100._56_16_ = (undefined1  [16])mp::operator*((double)in_stack_fffffffffffff570.impl_,e2_03)
  ;
  e1_00.expr_.super_ExprBase.impl_ = (ExprBase)(ExprBase)in_stack_fffffffffffff570.impl_;
  e1_00.bld_ = in_stack_fffffffffffff568;
  e2_00.bld_._4_4_ = in_stack_fffffffffffff55c;
  e2_00.bld_._0_4_ = in_stack_fffffffffffff558;
  e2_00.expr_.super_ExprBase.impl_ = (ExprBase)(ExprBase)in_stack_fffffffffffff560.impl_;
  local_38 = mp::operator+(e1_00,e2_00);
  expr.bld_._4_4_ = in_stack_fffffffffffff55c;
  expr.bld_._0_4_ = in_stack_fffffffffffff558;
  expr.expr_.super_ExprBase.impl_ = (ExprBase)(ExprBase)in_stack_fffffffffffff560.impl_;
  MVar7 = mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::AddAlgCon
                    (in_stack_fffffffffffff550,in_stack_fffffffffffff548,expr,
                     (double)in_stack_fffffffffffff540);
  this_00 = MVar7.
            super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
            .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.problem_;
  iVar6 = MVar7.
          super_BasicAlgebraicCon<mp::BasicProblem<mp::BasicProblemParams<int>_>::BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          .super_BasicProblemItem<mp::BasicProblem<mp::BasicProblemParams<int>_>_>.index_;
  local_100._24_8_ = this_00;
  local_100._32_4_ = iVar6;
  pIVar3 = InterfaceTesterWithBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>
           ::GetInterface(in_RDI);
  (*(pIVar3->
    super_ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
    ).
    super_ExprConverter<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
    .
    super_ExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr>
    .
    super_BasicExprVisitor<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::EExpr,_mp::internal::ExprTypes>
    ._vptr_BasicExprVisitor[2])();
  mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::GetVarIndices
            ((EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
             CONCAT44(iVar6,in_stack_fffffffffffff5a8),in_stack_fffffffffffff5a0);
  local_1b9.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>._1_8_ = 0x4048000000000000;
  local_1b9.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
  super_small_vector_data_base<double_*,_unsigned_long>._9_8_ = 0x4028000000000000;
  local_1b9.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data._17_8_ =
       0x400c000000000000;
  local_1b9.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data._1_8_
       = (long)&local_1b9.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr + 1;
  local_1b9.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage.m_data._9_8_
       = 3;
  this_04 = &local_1b9;
  std::allocator<double>::allocator((allocator<double> *)0x1488c8);
  __l._M_len = (size_type)in_stack_fffffffffffff570.impl_;
  __l._M_array = (iterator)in_stack_fffffffffffff568;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff560.impl_,__l,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  this_03 = (vector<int,_std::allocator<int>_> *)local_100;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_03,0);
  local_1f5._1_4_ = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_03,1);
  local_1f5._5_4_ = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_03,2);
  local_1f5._9_4_ = *pvVar4;
  local_1f5._13_8_ = local_1f5 + 1;
  local_1f5._21_8_ = 3;
  c_00 = (vector<double,_std::allocator<double>_> *)local_1f5;
  std::allocator<int>::allocator((allocator<int> *)0x148969);
  __l_00._M_len = (size_type)in_stack_fffffffffffff570.impl_;
  __l_00._M_array = (iterator)in_stack_fffffffffffff568;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff560.impl_,__l_00,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  mp::LinTerms::LinTerms(this_04,c_00,this_03);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff540);
  std::allocator<int>::~allocator((allocator<int> *)0x1489c6);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff540);
  std::allocator<double>::~allocator((allocator<double> *)0x1489e0);
  local_368 = 0x4040000000000000;
  local_378 = 0x4050000000000000;
  uStack_370 = 0x4010000000000000;
  local_360 = &local_378;
  local_358 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x148a2f);
  __l_01._M_len = (size_type)in_stack_fffffffffffff570.impl_;
  __l_01._M_array = (iterator)in_stack_fffffffffffff568;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff560.impl_,__l_01,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  __n = 0;
  pQVar5 = (QuadTerms *)local_100;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)pQVar5,0);
  local_3b4 = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)pQVar5,1);
  local_3b0 = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)pQVar5,__n);
  local_3ac = *pvVar4;
  local_3a8 = &local_3b4;
  local_3a0 = 3;
  std::allocator<int>::allocator((allocator<int> *)0x148ad5);
  __l_02._M_len = (size_type)pQVar5;
  __l_02._M_array = (iterator)in_stack_fffffffffffff568;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff560.impl_,__l_02,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  __a = (allocator_type *)local_100;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)__a,0);
  local_3ed._1_4_ = *pvVar4;
  this_02 = (vector<int,_std::allocator<int>_> *)0x1;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)__a,1);
  local_3ed._5_4_ = *pvVar4;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)__a,(size_type)this_02);
  local_3ed._9_4_ = *pvVar4;
  local_3ed._13_8_ = local_3ed + 1;
  local_3ed._21_8_ = 3;
  c = (vector<double,_std::allocator<double>_> *)local_3ed;
  std::allocator<int>::allocator((allocator<int> *)0x148b7b);
  __l_03._M_len = (size_type)pQVar5;
  __l_03._M_array = (iterator)c;
  std::vector<int,_std::allocator<int>_>::vector(this_02,__l_03,__a);
  mp::QuadTerms::QuadTerms(pQVar5,c,this_02,(vector<int,_std::allocator<int>_> *)__a);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff540);
  std::allocator<int>::~allocator((allocator<int> *)0x148be0);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff540);
  std::allocator<int>::~allocator((allocator<int> *)0x148bfa);
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_fffffffffffff540);
  std::allocator<double>::~allocator((allocator<double> *)0x148c14);
  pQVar5 = (QuadTerms *)
           InterfaceTesterWithBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>
           ::GetBackend((InterfaceTesterWithBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>
                         *)0x148c21);
  con = local_818;
  mp::LinTerms::LinTerms
            ((LinTerms *)in_stack_fffffffffffff530,
             (LinTerms *)CONCAT17(in_stack_fffffffffffff52f,in_stack_fffffffffffff528));
  this_01 = (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> *)(local_968 + 1);
  mp::QuadTerms::QuadTerms
            ((QuadTerms *)in_stack_fffffffffffff530,
             (QuadTerms *)CONCAT17(in_stack_fffffffffffff52f,in_stack_fffffffffffff528));
  mp::QuadAndLinTerms::QuadAndLinTerms((QuadAndLinTerms *)this_01,(LinTerms *)con,pQVar5);
  mp::AlgConRange::AlgConRange(local_968,-4.0,INFINITY);
  rr.ub_ = (double)this_02;
  rr.lb_ = (double)__a;
  mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>::AlgebraicConstraint
            (this_01,(QuadAndLinTerms *)con,rr,SUB81((ulong)pQVar5 >> 0x38,0));
  TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>::
  HasConstraint((TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>
                 *)this_01,con);
  line = (int)((ulong)con >> 0x20);
  testing::AssertionResult::AssertionResult
            ((AssertionResult *)in_stack_fffffffffffff530,(bool)in_stack_fffffffffffff52f);
  mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>::~AlgebraicConstraint
            (in_stack_fffffffffffff530);
  mp::QuadAndLinTerms::~QuadAndLinTerms((QuadAndLinTerms *)in_stack_fffffffffffff530);
  mp::QuadTerms::~QuadTerms((QuadTerms *)in_stack_fffffffffffff530);
  mp::LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffff530);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_400);
  if (!bVar1) {
    testing::Message::Message((Message *)this_02);
    InterfaceTesterWithBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>
    ::GetBackend((InterfaceTesterWithBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>
                  *)0x148f13);
    TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>::
    GetConstraintsPrintout_abi_cxx11_(in_stack_fffffffffffff708);
    in_stack_fffffffffffff530 =
         (AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> *)
         testing::Message::operator<<
                   ((Message *)in_stack_fffffffffffff530,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT17(in_stack_fffffffffffff52f,in_stack_fffffffffffff528));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT44(iVar6,in_stack_fffffffffffff5a8),(char *)this_04,
               (char *)c_00,(char *)this_03);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_02,(Type)((ulong)__a >> 0x20),(char *)this_01,line,
               (char *)pQVar5);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)this_00,(Message *)CONCAT44(iVar6,in_stack_fffffffffffff5a8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff530);
    std::__cxx11::string::~string(local_9b8);
    std::__cxx11::string::~string(local_990);
    testing::Message::~Message((Message *)0x148fe5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1490b2);
  mp::QuadTerms::~QuadTerms((QuadTerms *)in_stack_fffffffffffff530);
  mp::LinTerms::~LinTerms((LinTerms *)in_stack_fffffffffffff530);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)pQVar5);
  std::
  vector<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr,_std::allocator<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr>_>
  ::~vector((vector<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr,_std::allocator<mp::EasyModeler<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NumExpr>_>
             *)pQVar5);
  return;
}

Assistant:

TEST_F(InterfaceTester_QuadraticConstraint, Pow2_isMultipliedOutAndInlined) {
  auto modeler = mp::MakeEasyModeler(GetModel());
  auto x = modeler.AddVars(3, -1.0, 11.0);
  modeler.AddAlgCon(5.0,
                    ((8*x[0] + 2*x[1] + 3)^2)            // C++ operator precedence
                      + 3.5*x[2],
                    INFINITY);
  GetInterface().ConvertModel();
  const auto xi = modeler.GetVarIndices(x);
  auto lt = mp::LinTerms{ {48, 12, 3.5}, {xi[0], xi[1], xi[2]} };
  auto qt = mp::QuadTerms{ {64, 4, 32}, {xi[0], xi[1], xi[0]}, {xi[0], xi[1], xi[1]} };
  ASSERT_HAS_CONSTRAINT( GetBackend(), mp::QuadConRange(
    { std::move(lt), std::move(qt) },
    {-4.0, INFINITY} ) );
}